

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalBatchCopyToFile::FlushBatchData
          (PhysicalBatchCopyToFile *this,ClientContext *context,GlobalSinkState *gstate_p)

{
  mutex *pmVar1;
  pointer *__mutex;
  const_iterator __position;
  _Head_base<0UL,_duckdb::FixedPreparedBatchData_*,_false> _Var2;
  _Tuple_impl<0UL,_duckdb::PreparedBatchData_*,_std::default_delete<duckdb::PreparedBatchData>_>
  _Var3;
  copy_flush_batch_t p_Var4;
  _Head_base<0UL,_duckdb::PreparedBatchData_*,_false> _Var5;
  bool bVar6;
  _Head_base<0UL,_duckdb::FixedPreparedBatchData_*,_false> _Var7;
  int iVar8;
  type pFVar9;
  type pGVar10;
  pointer pFVar11;
  type pPVar12;
  InternalException *this_00;
  unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
  batch_data;
  _Head_base<0UL,_duckdb::FixedPreparedBatchData_*,_false> local_88;
  PhysicalBatchCopyToFile *local_80;
  __pthread_internal_list **local_78;
  BatchMemoryManager *local_70;
  pointer *local_68;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *local_60;
  ClientContext *local_58;
  string local_50;
  
  pmVar1 = &gstate_p[4].super_StateWithBlockableTasks.lock;
  local_80 = this;
  local_58 = context;
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
  if (iVar8 != 0) {
    ::std::__throw_system_error(iVar8);
  }
  if ((gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[8] & 1U) !=
      0) {
    pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
    return;
  }
  local_70 = (BatchMemoryManager *)(gstate_p + 1);
  LOCK();
  gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[8] = '\x01';
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
  LOCK();
  gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[8] = '\x01';
  UNLOCK();
  __mutex = &gstate_p[3].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_78 = &gstate_p[5].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
              __list.__next;
  local_60 = &local_80->bind_data;
  local_68 = &gstate_p[4].super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
              super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_88._M_head_impl = (FixedPreparedBatchData *)0x0;
    iVar8 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    _Var7._M_head_impl = local_88._M_head_impl;
    if (iVar8 != 0) {
      ::std::__throw_system_error(iVar8);
    }
    iVar8 = 3;
    if ((gstate_p[6]._vptr_GlobalSinkState == (_func_int **)0x0) ||
       (__position._M_node =
             (_Base_ptr)
             gstate_p[5].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,
       *(long *)(__position._M_node + 1) !=
       gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align)) {
      bVar6 = false;
    }
    else {
      if (*(ulong *)(__position._M_node + 1) <
          (ulong)gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align)
      {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Batch index was out of order!?","");
        InternalException::InternalException(this_00,&local_50);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      _Var2._M_head_impl = (FixedPreparedBatchData *)__position._M_node[1]._M_parent;
      __position._M_node[1]._M_parent = (_Base_ptr)0x0;
      if ((_Base_ptr)local_88._M_head_impl != (_Base_ptr)0x0) {
        _Var3.super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false>._M_head_impl =
             ((local_88._M_head_impl)->prepared_data).
             super_unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::PreparedBatchData_*,_std::default_delete<duckdb::PreparedBatchData>_>
             .super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false>;
        local_88._M_head_impl = _Var2._M_head_impl;
        if (_Var3.super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false>._M_head_impl !=
            (PreparedBatchData *)0x0) {
          (**(code **)(*(long *)_Var3.super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false>.
                                _M_head_impl + 8))();
        }
        ((_Var7._M_head_impl)->prepared_data).
        super_unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PreparedBatchData_*,_std::default_delete<duckdb::PreparedBatchData>_>
        .super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false> =
             (_Head_base<0UL,_duckdb::PreparedBatchData_*,_false>)0x0;
        operator_delete(_Var7._M_head_impl);
        _Var2._M_head_impl = local_88._M_head_impl;
      }
      local_88._M_head_impl = _Var2._M_head_impl;
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>_>_>_>
      ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>_>_>_>
                      *)local_78,__position);
      iVar8 = 0;
      bVar6 = true;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (bVar6) {
      p_Var4 = (local_80->function).flush_batch;
      pFVar9 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
               operator*(local_60);
      pGVar10 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                             *)local_68);
      pFVar11 = unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
                ::operator->((unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
                              *)&local_88);
      pPVar12 = unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>,_true>
                ::operator*(&pFVar11->prepared_data);
      (*p_Var4)(local_58,pFVar9,pGVar10,pPVar12);
      pFVar11 = unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
                ::operator->((unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
                              *)&local_88);
      _Var5._M_head_impl =
           (pFVar11->prepared_data).
           super_unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PreparedBatchData_*,_std::default_delete<duckdb::PreparedBatchData>_>
           .super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false>._M_head_impl;
      (pFVar11->prepared_data).
      super_unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PreparedBatchData_*,_std::default_delete<duckdb::PreparedBatchData>_>
      .super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false>._M_head_impl =
           (PreparedBatchData *)0x0;
      if (_Var5._M_head_impl != (PreparedBatchData *)0x0) {
        (*(_Var5._M_head_impl)->_vptr_PreparedBatchData[1])();
      }
      pFVar11 = unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
                ::operator->((unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
                              *)&local_88);
      BatchMemoryManager::ReduceUnflushedMemory(local_70,pFVar11->memory_usage);
      LOCK();
      pmVar1 = &gstate_p[6].super_StateWithBlockableTasks.lock;
      (pmVar1->super___mutex_base)._M_mutex.__align =
           (pmVar1->super___mutex_base)._M_mutex.__align + 1;
      UNLOCK();
      iVar8 = 0;
    }
    ::std::
    unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
    ::~unique_ptr((unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
                   *)&local_88);
  } while (iVar8 == 0);
  LOCK();
  gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[8] = '\0';
  UNLOCK();
  return;
}

Assistant:

void PhysicalBatchCopyToFile::FlushBatchData(ClientContext &context, GlobalSinkState &gstate_p) const {
	auto &gstate = gstate_p.Cast<FixedBatchCopyGlobalState>();
	auto &memory_manager = gstate.memory_manager;

	// flush batch data to disk (if there are any to flush)
	// grab the flush lock - we can only call flush_batch with this lock
	// otherwise the data might end up in the wrong order
	{
		lock_guard<mutex> l(gstate.flush_lock);
		if (gstate.any_flushing) {
			return;
		}
		gstate.any_flushing = true;
	}
	ActiveFlushGuard active_flush(gstate.any_flushing);
	while (true) {
		unique_ptr<FixedPreparedBatchData> batch_data;
		{
			lock_guard<mutex> l(gstate.lock);
			if (gstate.batch_data.empty()) {
				// no batch data left to flush
				break;
			}
			auto entry = gstate.batch_data.begin();
			if (entry->first != gstate.flushed_batch_index) {
				// this entry is not yet ready to be flushed
				break;
			}
			if (entry->first < gstate.flushed_batch_index) {
				throw InternalException("Batch index was out of order!?");
			}
			batch_data = std::move(entry->second);
			gstate.batch_data.erase(entry);
		}
		function.flush_batch(context, *bind_data, *gstate.global_state, *batch_data->prepared_data);
		batch_data->prepared_data.reset();
		memory_manager.ReduceUnflushedMemory(batch_data->memory_usage);
		gstate.flushed_batch_index++;
	}
}